

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O0

void __thiscall
raft_functional_common::TestSm::save_logical_snp_obj
          (TestSm *this,snapshot *s,ulong *obj_id,buffer *data,bool is_first_obj,bool is_last_obj)

{
  __int_type _Var1;
  size_t sVar2;
  element_type *src;
  mapped_type *this_00;
  buffer *in_RCX;
  long *in_RDX;
  undefined4 in_R8D;
  byte in_R9B;
  size_t in_stack_00000048;
  ptr<buffer> data_precommit;
  ptr<buffer> data_commit;
  int32 data_size;
  ulong log_idx;
  buffer_serializer bs;
  string *in_stack_fffffffffffffef8;
  __shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff00;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff08;
  buffer_serializer *this_01;
  buffer_serializer *this_02;
  buffer_serializer *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  EVP_PKEY_CTX local_a0 [16];
  buffer_serializer local_90;
  uint64_t local_78;
  buffer_serializer local_70;
  buffer_serializer local_48;
  byte local_22;
  byte local_21;
  buffer *local_20;
  long *local_18;
  
  local_21 = (byte)in_R8D & 1;
  local_22 = in_R9B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff08);
  if (_Var1 != 0) {
    std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff30 = &local_48;
    std::__cxx11::string::string((string *)in_stack_ffffffffffffff30);
    TestSuite::sleep_ms((size_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if (*local_18 == 0) {
    *local_18 = *local_18 + 1;
  }
  else {
    sVar2 = nuraft::buffer::size(local_20);
    if (sVar2 == 8) {
      *local_18 = *local_18 + 1;
    }
    else {
      this_01 = &local_70;
      nuraft::buffer_serializer::buffer_serializer(this_01,local_20,LITTLE);
      local_78 = nuraft::buffer_serializer::get_u64(in_stack_ffffffffffffff30);
      local_90.pos_._4_4_ = nuraft::buffer_serializer::get_i32(in_stack_ffffffffffffff30);
      this_02 = &local_90;
      nuraft::buffer::alloc(in_stack_00000048);
      nuraft::buffer_serializer::get_buffer(this_02,(ptr<buffer> *)this_01);
      std::
      map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
      ::operator[]((map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
                    *)in_RCX,(key_type *)CONCAT44(in_R8D,in_stack_ffffffffffffff38));
      std::shared_ptr<nuraft::buffer>::operator=
                ((shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffff00,
                 (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffef8);
      src = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*(in_stack_ffffffffffffff00);
      nuraft::buffer::copy(local_a0,(EVP_PKEY_CTX *)src);
      this_00 = std::
                map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
                ::operator[]((map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
                              *)in_RCX,(key_type *)CONCAT44(in_R8D,in_stack_ffffffffffffff38));
      std::shared_ptr<nuraft::buffer>::operator=
                (this_00,(shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffef8);
      *local_18 = *local_18 + 1;
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x133655);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x13365f);
    }
  }
  return;
}

Assistant:

void save_logical_snp_obj(snapshot& s,
                              ulong& obj_id,
                              buffer& data,
                              bool is_first_obj,
                              bool is_last_obj)
    {
        if (snpDelayMs) {
            TestSuite::sleep_ms(snpDelayMs);
        }

        if (obj_id == 0) {
            // Special object containing metadata.
            // Request next object.
            obj_id++;
            return;
        }

        if (data.size() == sizeof(ulong)) {
            // Special object representing config change.
            // Nothing to do for state machine.
            // Request next object.
            obj_id++;
            return;
        }

        buffer_serializer bs(data);
        ulong log_idx = bs.get_u64();

        // In this test state machine implementation,
        // obj id should be always the same as log index.
        assert(log_idx == obj_id);

        int32 data_size = bs.get_i32();
        ptr<buffer> data_commit = buffer::alloc(data_size);
        bs.get_buffer( data_commit );

        commits[log_idx] = data_commit;

        ptr<buffer> data_precommit = buffer::copy(*data_commit);
        preCommits[log_idx] = data_precommit;

        // Request next object.
        obj_id++;
    }